

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# senary_executor.hpp
# Opt level: O2

void duckdb::SenaryExecutor::
     Execute<long,long,long,long,long,double,duckdb::timestamp_t,duckdb::timestamp_t(*)(long,long,long,long,long,double)>
               (DataChunk *input,Vector *result,
               _func_timestamp_t_long_long_long_long_long_double *fun)

{
  ulong *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  data_ptr_t pdVar8;
  sel_t *psVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long *plVar13;
  long *plVar14;
  long *plVar15;
  long *plVar16;
  int64_t *piVar17;
  Vector *v;
  pointer pVVar18;
  reference pvVar19;
  reference pvVar20;
  reference pvVar21;
  timestamp_t tVar22;
  size_t c;
  size_type __n;
  size_type sVar23;
  vector<duckdb::Vector,_true> *__range2;
  value_type row_idx;
  value_type vVar24;
  idx_t iVar25;
  bool bVar26;
  allocator_type local_c1;
  long *local_c0;
  _func_timestamp_t_long_long_long_long_long_double *local_b8;
  long local_b0;
  long local_a8;
  vector<duckdb::UnifiedVectorFormat,_true> vdata;
  vector<unsigned_long,_true> idx;
  
  local_c0 = (long *)input->count;
  pVVar18 = (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar26 = false;
  while( true ) {
    local_b8 = fun;
    if (pVVar18 ==
        (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      if (!bVar26) {
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,0);
        local_c0 = (long *)pvVar19->data;
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,1);
        plVar13 = (long *)pvVar19->data;
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,2);
        plVar14 = (long *)pvVar19->data;
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,3);
        plVar15 = (long *)pvVar19->data;
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,4);
        plVar16 = (long *)pvVar19->data;
        pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,5);
        piVar17 = (int64_t *)result->data;
        tVar22 = (*local_b8)(*local_c0,*plVar13,*plVar14,*plVar15,*plVar16,*(double *)pvVar19->data)
        ;
        *piVar17 = tVar22.value;
        return;
      }
      ConstantVector::SetNull(result,true);
      return;
    }
    if (pVVar18->vector_type != CONSTANT_VECTOR) break;
    puVar1 = (pVVar18->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar1 != (ulong *)0x0) {
      bVar26 = (bool)(bVar26 | (*puVar1 & 1) == 0);
    }
    pVVar18 = pVVar18 + 1;
  }
  Vector::SetVectorType(result,FLAT_VECTOR);
  pdVar2 = result->data;
  FlatVector::VerifyFlatVector(result);
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::vector
            (&vdata.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
             ,6,(allocator_type *)&idx);
  bVar26 = true;
  for (__n = 0; __n != 6; __n = __n + 1) {
    pvVar19 = vector<duckdb::Vector,_true>::get<true>(&input->data,__n);
    pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                        ((vector<duckdb::UnifiedVectorFormat,_true> *)
                         &vdata.
                          super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
                         ,__n);
    Vector::ToUnifiedFormat(pvVar19,(idx_t)local_c0,pvVar20);
    if (bVar26) {
      pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>
                          ((vector<duckdb::UnifiedVectorFormat,_true> *)
                           &vdata.
                            super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
                           ,__n);
      bVar26 = (pvVar20->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
               (unsigned_long *)0x0;
    }
    else {
      bVar26 = false;
    }
  }
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,0);
  pdVar3 = pvVar20->data;
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,1);
  pdVar4 = pvVar20->data;
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,2);
  pdVar5 = pvVar20->data;
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,3);
  pdVar6 = pvVar20->data;
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,4);
  pdVar7 = pvVar20->data;
  pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,5);
  pdVar8 = pvVar20->data;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&idx.super_vector<unsigned_long,_std::allocator<unsigned_long>_>,6,&local_c1);
  row_idx = 0;
  if (bVar26) {
    for (; (long *)row_idx != local_c0; row_idx = row_idx + 1) {
      for (sVar23 = 0; sVar23 != 6; sVar23 = sVar23 + 1) {
        pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,sVar23);
        psVar9 = pvVar20->sel->sel_vector;
        vVar24 = row_idx;
        if (psVar9 != (sel_t *)0x0) {
          vVar24 = (value_type)psVar9[row_idx];
        }
        pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,sVar23);
        *pvVar21 = vVar24;
      }
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,0);
      local_a8 = *(long *)(pdVar3 + *pvVar21 * 8);
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,1);
      local_b0 = *(long *)(pdVar4 + *pvVar21 * 8);
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,2);
      lVar10 = *(long *)(pdVar5 + *pvVar21 * 8);
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,3);
      lVar11 = *(long *)(pdVar6 + *pvVar21 * 8);
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,4);
      lVar12 = *(long *)(pdVar7 + *pvVar21 * 8);
      pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,5);
      tVar22 = (*local_b8)(local_a8,local_b0,lVar10,lVar11,lVar12,*(double *)(pdVar8 + *pvVar21 * 8)
                          );
      *(int64_t *)(pdVar2 + row_idx * 8) = tVar22.value;
    }
  }
  else {
    for (; (long *)row_idx != local_c0; row_idx = row_idx + 1) {
      sVar23 = 0;
      do {
        if (sVar23 == 6) {
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,0);
          local_a8 = *(long *)(pdVar3 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,1);
          local_b0 = *(long *)(pdVar4 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,2);
          lVar10 = *(long *)(pdVar5 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,3);
          lVar11 = *(long *)(pdVar6 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,4);
          lVar12 = *(long *)(pdVar7 + *pvVar21 * 8);
          pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,5);
          tVar22 = (*local_b8)(local_a8,local_b0,lVar10,lVar11,lVar12,
                               *(double *)(pdVar8 + *pvVar21 * 8));
          *(int64_t *)(pdVar2 + row_idx * 8) = tVar22.value;
          goto LAB_01e00aec;
        }
        pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,sVar23);
        psVar9 = pvVar20->sel->sel_vector;
        iVar25 = row_idx;
        if (psVar9 != (sel_t *)0x0) {
          iVar25 = (idx_t)psVar9[row_idx];
        }
        pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,sVar23);
        *pvVar21 = iVar25;
        pvVar20 = vector<duckdb::UnifiedVectorFormat,_true>::get<true>(&vdata,sVar23);
        pvVar21 = vector<unsigned_long,_true>::get<true>(&idx,sVar23);
        bVar26 = TemplatedValidityMask<unsigned_long>::RowIsValid
                           (&(pvVar20->validity).super_TemplatedValidityMask<unsigned_long>,*pvVar21
                           );
        sVar23 = sVar23 + 1;
      } while (bVar26);
      TemplatedValidityMask<unsigned_long>::SetInvalid
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
LAB_01e00aec:
    }
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&idx);
  ::std::vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>::~vector
            (&vdata.
              super_vector<duckdb::UnifiedVectorFormat,_std::allocator<duckdb::UnifiedVectorFormat>_>
            );
  return;
}

Assistant:

static void Execute(DataChunk &input, Vector &result, FUN fun) {
		D_ASSERT(input.ColumnCount() >= NCOLS);
		const auto count = input.size();

		bool all_constant = true;
		bool any_null = false;
		for (const auto &v : input.data) {
			if (v.GetVectorType() == VectorType::CONSTANT_VECTOR) {
				if (ConstantVector::IsNull(v)) {
					any_null = true;
				}
			} else {
				all_constant = false;
				break;
			}
		}

		if (all_constant) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			if (any_null) {
				ConstantVector::SetNull(result, true);
			} else {
				auto adata = ConstantVector::GetData<TA>(input.data[0]);
				auto bdata = ConstantVector::GetData<TB>(input.data[1]);
				auto cdata = ConstantVector::GetData<TC>(input.data[2]);
				auto ddata = ConstantVector::GetData<TD>(input.data[3]);
				auto edata = ConstantVector::GetData<TE>(input.data[4]);
				auto fdata = ConstantVector::GetData<TF>(input.data[5]);
				auto result_data = ConstantVector::GetData<TR>(result);
				result_data[0] = fun(*adata, *bdata, *cdata, *ddata, *edata, *fdata);
			}
		} else {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<TR>(result);
			auto &result_validity = FlatVector::Validity(result);

			bool all_valid = true;
			vector<UnifiedVectorFormat> vdata(NCOLS);
			for (size_t c = 0; c < NCOLS; ++c) {
				input.data[c].ToUnifiedFormat(count, vdata[c]);
				all_valid = all_valid && vdata[c].validity.AllValid();
			}

			auto adata = (const TA *)(vdata[0].data);
			auto bdata = (const TB *)(vdata[1].data);
			auto cdata = (const TC *)(vdata[2].data);
			auto ddata = (const TD *)(vdata[3].data);
			auto edata = (const TE *)(vdata[4].data);
			auto fdata = (const TF *)(vdata[5].data);

			vector<idx_t> idx(NCOLS);
			if (all_valid) {
				for (idx_t r = 0; r < count; ++r) {
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
					}
					result_data[r] =
					    fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]], fdata[idx[5]]);
				}
			} else {
				for (idx_t r = 0; r < count; ++r) {
					all_valid = true;
					for (size_t c = 0; c < NCOLS; ++c) {
						idx[c] = vdata[c].sel->get_index(r);
						if (!vdata[c].validity.RowIsValid(idx[c])) {
							result_validity.SetInvalid(r);
							all_valid = false;
							break;
						}
					}
					if (all_valid) {
						result_data[r] = fun(adata[idx[0]], bdata[idx[1]], cdata[idx[2]], ddata[idx[3]], edata[idx[4]],
						                     fdata[idx[5]]);
					}
				}
			}
		}
	}